

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

int __thiscall
cmCTestCoverageHandler::HandleBullseyeCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  ostream *poVar6;
  string local_6b8 [32];
  undefined1 local_698 [8];
  ostringstream cmCTestLog_msg_3;
  string local_520 [32];
  undefined1 local_500 [8];
  ostringstream cmCTestLog_msg_2;
  string local_388 [32];
  undefined1 local_368 [8];
  ostringstream cmCTestLog_msg_1;
  string local_1e8 [32];
  undefined1 local_1c8 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_40 [8];
  string covfile;
  cmCTestCoverageHandlerContainer *cont_local;
  cmCTestCoverageHandler *this_local;
  
  covfile.field_2._8_8_ = cont;
  std::__cxx11::string::string((string *)local_40);
  bVar2 = cmsys::SystemTools::GetEnv("COVFILE",(string *)local_40);
  if ((bVar2) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_368);
    poVar6 = std::operator<<((ostream *)local_368," run covsrc with COVFILE=[");
    poVar6 = std::operator<<(poVar6,(string *)local_40);
    poVar6 = std::operator<<(poVar6,"]");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x813,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string(local_388);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_368);
    iVar3 = RunBullseyeSourceSummary(this,(cmCTestCoverageHandlerContainer *)covfile.field_2._8_8_);
    if (iVar3 == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_500);
      std::operator<<((ostream *)local_500,"Error running bullseye summary.\n");
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x816,pcVar5,false);
      std::__cxx11::string::~string(local_520);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_500);
      this_local._4_4_ = 0;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_698);
      poVar6 = std::operator<<((ostream *)local_698,"HandleBullseyeCoverage return 1 ");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x81b,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string(local_6b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_698);
      this_local._4_4_ = 1;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    std::operator<<((ostream *)local_1c8,
                    " COVFILE environment variable not found, not running  bullseye\n");
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x80e,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    this_local._4_4_ = 0;
  }
  std::__cxx11::string::~string((string *)local_40);
  return this_local._4_4_;
}

Assistant:

int cmCTestCoverageHandler::HandleBullseyeCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  std::string covfile;
  if (!cmSystemTools::GetEnv("COVFILE", covfile) || covfile.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " COVFILE environment variable not found, not running "
                       " bullseye\n",
                       this->Quiet);
    return 0;
  }
  cmCTestOptionalLog(
    this->CTest, HANDLER_VERBOSE_OUTPUT,
    " run covsrc with COVFILE=[" << covfile << "]" << std::endl, this->Quiet);
  if (!this->RunBullseyeSourceSummary(cont)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error running bullseye summary.\n");
    return 0;
  }
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "HandleBullseyeCoverage return 1 " << std::endl,
                     this->Quiet);
  return 1;
}